

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test::~AV1LbdInvTxfm2d_gt_int16_Test
          (AV1LbdInvTxfm2d_gt_int16_Test *this)

{
  AV1LbdInvTxfm2d_gt_int16_Test *unaff_retaddr;
  
  anon_unknown.dwarf_efad74::AV1LbdInvTxfm2d_gt_int16_Test::~AV1LbdInvTxfm2d_gt_int16_Test
            (unaff_retaddr);
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, gt_int16) {
  static const TxType types[] = { DCT_DCT, ADST_DCT, FLIPADST_DCT, IDTX,
                                  V_DCT,   H_DCT,    H_ADST,       H_FLIPADST };
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    const TxSize sz = static_cast<TxSize>(j);
    for (uint8_t i = 0; i < sizeof(types) / sizeof(types[0]); ++i) {
      const TxType tp = types[i];
      if (libaom_test::IsTxSizeTypeValid(sz, tp)) {
        RunAV1InvTxfm2dTest(tp, sz, 1, 1);
      }
    }
  }
}